

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall
CRenderTools::SelectSprite(CRenderTools *this,CDataSprite *pSpr,int Flags,int sx,int sy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  undefined4 in_XMM5_Dc;
  undefined4 in_XMM5_Dd;
  
  iVar1 = pSpr->m_W;
  iVar2 = pSpr->m_H;
  iVar3 = pSpr->m_pSet->m_Gridx;
  iVar4 = pSpr->m_pSet->m_Gridy;
  fVar7 = SQRT((float)(iVar1 * iVar1 + iVar2 * iVar2));
  gs_SpriteWScale = (float)iVar1 / fVar7;
  gs_SpriteHScale = (float)iVar2 / fVar7;
  auVar5._0_4_ = (float)iVar3;
  auVar5._4_4_ = (float)(iVar3 << 5);
  auVar5._8_8_ = 0;
  auVar8._4_4_ = 0x3f000000;
  auVar8._0_4_ = (float)(sx + pSpr->m_X);
  auVar8._8_4_ = in_XMM5_Dc;
  auVar8._12_4_ = in_XMM5_Dd;
  divps(auVar8,auVar5);
  auVar6._0_4_ = (float)iVar4;
  auVar6._4_4_ = (float)(iVar4 << 5);
  auVar6._8_8_ = 0;
  auVar9._4_4_ = 0x3f000000;
  auVar9._0_4_ = (float)(sy + pSpr->m_Y);
  auVar9._8_4_ = in_XMM4_Dc;
  auVar9._12_4_ = in_XMM4_Dd;
  divps(auVar9,auVar6);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1a])(this->m_pGraphics,0xffffffff);
  return;
}

Assistant:

void CRenderTools::SelectSprite(const CDataSprite *pSpr, int Flags, int sx, int sy)
{
	int x = pSpr->m_X+sx;
	int y = pSpr->m_Y+sy;
	int w = pSpr->m_W;
	int h = pSpr->m_H;
	int cx = pSpr->m_pSet->m_Gridx;
	int cy = pSpr->m_pSet->m_Gridy;

	float f = sqrtf(h*h + w*w);
	gs_SpriteWScale = w/f;
	gs_SpriteHScale = h/f;

	float x1 = x/(float)cx + 0.5f/(float)(cx*32);
	float x2 = (x+w)/(float)cx - 0.5f/(float)(cx*32);
	float y1 = y/(float)cy + 0.5f/(float)(cy*32);
	float y2 = (y+h)/(float)cy - 0.5f/(float)(cy*32);

	if(Flags&SPRITE_FLAG_FLIP_Y)
		std::swap(y1, y2);

	if(Flags&SPRITE_FLAG_FLIP_X)
		std::swap(x1, x2);

	Graphics()->QuadsSetSubset(x1, y1, x2, y2);
}